

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

void reportHessian(HighsLogOptions *log_options,HighsInt dim,HighsInt num_nz,HighsInt *start,
                  HighsInt *index,double *value)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (0 < dim) {
    highsLogUser(log_options,kInfo,"Hessian Index              Value\n");
    for (uVar2 = 0; uVar2 != (uint)dim; uVar2 = uVar2 + 1) {
      highsLogUser(log_options,kInfo,"    %8d Start   %10d\n",uVar2 & 0xffffffff,
                   (ulong)(uint)start[uVar2]);
      iVar1 = num_nz;
      if (uVar2 < dim - 1) {
        iVar1 = start[uVar2 + 1];
      }
      for (lVar3 = (long)start[uVar2]; lVar3 < iVar1; lVar3 = lVar3 + 1) {
        highsLogUser(log_options,kInfo,"          %8d %12g\n",value[lVar3],(ulong)(uint)index[lVar3]
                    );
      }
    }
    highsLogUser(log_options,kInfo,"             Start   %10d\n",(ulong)(uint)num_nz);
    return;
  }
  return;
}

Assistant:

void reportHessian(const HighsLogOptions& log_options, const HighsInt dim,
                   const HighsInt num_nz, const HighsInt* start,
                   const HighsInt* index, const double* value) {
  if (dim <= 0) return;
  highsLogUser(log_options, HighsLogType::kInfo,
               "Hessian Index              Value\n");
  for (HighsInt col = 0; col < dim; col++) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "    %8" HIGHSINT_FORMAT " Start   %10" HIGHSINT_FORMAT "\n",
                 col, start[col]);
    HighsInt to_el = (col < dim - 1 ? start[col + 1] : num_nz);
    for (HighsInt el = start[col]; el < to_el; el++)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "          %8" HIGHSINT_FORMAT " %12g\n", index[el],
                   value[el]);
  }
  highsLogUser(log_options, HighsLogType::kInfo,
               "             Start   %10" HIGHSINT_FORMAT "\n", num_nz);
}